

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O0

uint64_t __thiscall soul::Type::getPackedSizeInBytes(Type *this)

{
  bool bVar1;
  uint64_t uVar2;
  ArraySize AVar3;
  Structure *this_00;
  Type local_30;
  Type *local_18;
  Type *this_local;
  
  local_18 = this;
  bVar1 = isVector(this);
  if (bVar1) {
    uVar2 = PrimitiveType::getPackedSizeInBytes(&this->primitiveType);
    AVar3 = getVectorSize(this);
    this_local = (Type *)(uVar2 * AVar3);
  }
  else {
    bVar1 = isUnsizedArray(this);
    if (bVar1) {
      this_local = (Type *)0x8;
    }
    else {
      bVar1 = isArray(this);
      if (bVar1) {
        getArrayElementType(&local_30,this);
        uVar2 = getPackedSizeInBytes(&local_30);
        AVar3 = getArraySize(this);
        this_local = (Type *)(uVar2 * AVar3);
        ~Type(&local_30);
      }
      else {
        bVar1 = isStruct(this);
        if (bVar1) {
          this_00 = RefCountedPtr<soul::Structure>::operator->(&this->structure);
          this_local = (Type *)Structure::getPackedSizeInBytes(this_00);
        }
        else {
          bVar1 = isStringLiteral(this);
          if (bVar1) {
            this_local = (Type *)0x4;
          }
          else {
            this_local = (Type *)PrimitiveType::getPackedSizeInBytes(&this->primitiveType);
          }
        }
      }
    }
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t Type::getPackedSizeInBytes() const
{
    if (isVector())         return primitiveType.getPackedSizeInBytes() * static_cast<uint64_t> (getVectorSize());
    if (isUnsizedArray())   return sizeof (void*);
    if (isArray())          return getArrayElementType().getPackedSizeInBytes() * static_cast<uint64_t> (getArraySize());
    if (isStruct())         return structure->getPackedSizeInBytes();
    if (isStringLiteral())  return sizeof (StringDictionary::Handle);

    return primitiveType.getPackedSizeInBytes();
}